

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cConditionalRenderInvertedTests.cpp
# Opt level: O0

bool __thiscall
gl4cts::ConditionalRenderInverted::CoverageTest::test(CoverageTest *this,GLenum mode)

{
  int iVar1;
  deUint32 err;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  TestContext *this_00;
  TestLog *this_01;
  MessageBuilder *pMVar3;
  GLchar *local_1c0 [3];
  MessageBuilder local_1a8;
  byte local_21;
  long lStack_20;
  bool is_no_error;
  Functions *gl;
  CoverageTest *pCStack_10;
  GLenum mode_local;
  CoverageTest *this_local;
  
  gl._4_4_ = mode;
  pCStack_10 = this;
  pRVar2 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar1);
  local_21 = 1;
  (**(code **)(lStack_20 + 0x18))(this->m_qo_id,gl._4_4_);
  while( true ) {
    iVar1 = (**(code **)(lStack_20 + 0x800))();
    if (iVar1 == 0) break;
    local_21 = 0;
  }
  if ((local_21 & 1) != 0) {
    (**(code **)(lStack_20 + 0x620))();
    err = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(err,"glEndConditionalRender() call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cConditionalRenderInvertedTests.cpp"
                    ,199);
  }
  if ((local_21 & 1) == 0) {
    this_00 = deqp::Context::getTestContext((this->super_TestCase).m_context);
    this_01 = tcu::TestContext::getLog(this_00);
    tcu::TestLog::operator<<(&local_1a8,this_01,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar3 = tcu::MessageBuilder::operator<<
                       (&local_1a8,
                        (char (*) [53])"glBeginConditionalRender failed when used with mode ");
    local_1c0[0] = Utilities::modeToChars(gl._4_4_);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,local_1c0);
    pMVar3 = tcu::MessageBuilder::operator<<(pMVar3,(char (*) [2])0x2b5e49a);
    tcu::MessageBuilder::operator<<(pMVar3,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_1a8);
  }
  return (bool)(local_21 & 1);
}

Assistant:

bool gl4cts::ConditionalRenderInverted::CoverageTest::test(glw::GLenum mode)
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Default return value;*/
	bool is_no_error = true;

	/* Test. */
	gl.beginConditionalRender(m_qo_id, mode);

	while (GL_NO_ERROR != gl.getError())
	{
		is_no_error = false;
	}

	/* Clean up. */
	if (is_no_error)
	{
		gl.endConditionalRender();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndConditionalRender() call failed.");
	}

	/* Logging. */
	if (!is_no_error)
	{
		m_context.getTestContext().getLog() << tcu::TestLog::Message
											<< "glBeginConditionalRender failed when used with mode "
											<< Utilities::modeToChars(mode) << "." << tcu::TestLog::EndMessage;
	}

	/* Return test result. */
	return is_no_error;
}